

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::addSubwords
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,string_view token,int32_t wid)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  const_pointer pvVar2;
  element_type *peVar3;
  iterator __first;
  const_iterator __last;
  const_iterator this_00;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  Dictionary *in_RSI;
  char *in_RDI;
  int in_R8D;
  vector<int,_std::allocator<int>_> *ngrams;
  string concat;
  undefined4 in_stack_ffffffffffffff18;
  int32_t in_stack_ffffffffffffff1c;
  Dictionary *in_stack_ffffffffffffff20;
  value_type_conflict1 *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  string *this_02;
  const_iterator in_stack_ffffffffffffff78;
  string local_68 [32];
  undefined1 local_48 [16];
  undefined4 in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  if (in_R8D < 0) {
    local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)EOS_abi_cxx11_);
    __x._M_str = in_RDI;
    __x._M_len = in_stack_ffffffffffffff48;
    __y._M_str = in_stack_ffffffffffffff40;
    __y._M_len = in_stack_ffffffffffffff38;
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      this_02 = local_68;
      std::__cxx11::string::string(this_02);
      std::__cxx11::string::size();
      std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)this_02);
      std::__cxx11::string::operator+=(local_68,(string *)BOW_abi_cxx11_);
      this_01 = &local_10;
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::size(this_01);
      std::__cxx11::string::append((char *)local_68,(ulong)pvVar2);
      std::__cxx11::string::operator+=(local_68,(string *)EOW_abi_cxx11_);
      computeSubwords(in_RSI,(string *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_RCX,in_RDX);
      std::__cxx11::string::~string(local_68);
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x188d06);
    if (peVar3->maxn < 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    else {
      getSubwords(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      __first = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RSI,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      __last = std::vector<int,_std::allocator<int>_>::cbegin
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      this_00 = std::vector<int,_std::allocator<int>_>::cend
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,_std::allocator<int>_> *)this_00._M_current,in_stack_ffffffffffffff78,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __first._M_current,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __last._M_current);
    }
  }
  return;
}

Assistant:

void Dictionary::addSubwords(
    std::vector<int32_t>& line,
    const std::string_view token,
    int32_t wid) const {
  if (wid < 0) { // out of vocab
    if (token != EOS) {
      std::string concat;
      concat.reserve(BOW.size() + token.size() + EOW.size());
      concat += BOW;
      concat.append(token.data(), token.size());
      concat += EOW;
      computeSubwords(concat, line);
    }
  } else {
    if (args_->maxn <= 0) { // in vocab w/o subwords
      line.push_back(wid);
    } else { // in vocab w/ subwords
      const std::vector<int32_t>& ngrams = getSubwords(wid);
      line.insert(line.end(), ngrams.cbegin(), ngrams.cend());
    }
  }
}